

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
GenerateAttributesEncoder
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this,
          int32_t att_id)

{
  Mesh *mesh;
  TraversalObserver traversal_observer;
  MeshAttributeCornerTable *connectivity;
  bool bVar1;
  int iVar2;
  Type TVar3;
  int32_t iVar4;
  MeshEncoder *this_00;
  PointCloudEncoder *pPVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  EncoderOptions *this_01;
  pointer pMVar9;
  int in_ESI;
  long *in_RDI;
  vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
  *this_02;
  unique_ptr<draco::SequentialAttributeEncodersController,_std::default_delete<draco::SequentialAttributeEncodersController>_>
  att_controller;
  AttTraverser att_traverser;
  AttObserver att_observer;
  unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
  traversal_sequencer;
  MeshAttributeCornerTable *corner_table;
  MeshAttributeIndicesEncodingData *encoding_data_1;
  MeshAttributeIndicesEncodingData *encoding_data;
  unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> sequencer;
  MeshTraversalMethod traversal_method;
  uint32_t i;
  int32_t att_data_id;
  PointAttribute *att;
  int32_t element_type;
  MeshAttributeCornerTable *in_stack_fffffffffffffda8;
  Mesh *in_stack_fffffffffffffdb0;
  Mesh *in_stack_fffffffffffffdb8;
  SequentialAttributeEncodersController *in_stack_fffffffffffffdc0;
  CornerTable *in_stack_fffffffffffffdc8;
  MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
  *in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  MeshTraversalMethod MVar10;
  PointsSequencer *pPVar11;
  MeshAttributeIndicesEncodingData *in_stack_fffffffffffffef0;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
  *in_stack_fffffffffffffef8;
  MeshAttributeIndicesEncodingData *in_stack_ffffffffffffff40;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>
  *in_stack_ffffffffffffff48;
  MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable> local_a8;
  PointsSequencer local_88;
  MeshAttributeCornerTable *local_78;
  MeshAttributeIndicesEncodingData *local_70;
  undefined4 local_54;
  MeshAttributeIndicesEncodingData *local_50;
  MeshTraversalMethod local_2c;
  uint local_28;
  uint local_24;
  PointAttribute *local_20;
  MeshAttributeElementType local_18;
  int local_14;
  byte local_1;
  
  local_14 = in_ESI;
  if ((*(byte *)(in_RDI + 0x56) & 1) != 0) {
    (**(code **)(*in_RDI + 0x50))();
    iVar2 = PointCloudEncoder::num_attributes_encoders((PointCloudEncoder *)0x1997c5);
    if (0 < iVar2) {
      (**(code **)(*in_RDI + 0x50))();
      iVar4 = (int32_t)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
      PointCloudEncoder::attributes_encoder
                ((PointCloudEncoder *)in_stack_fffffffffffffdb0,
                 (int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
      AttributesEncoder::AddAttributeId(&in_stack_fffffffffffffdc0->super_AttributesEncoder,iVar4);
      local_1 = 1;
      goto LAB_0019a0c0;
    }
  }
  this_00 = (MeshEncoder *)(**(code **)(*in_RDI + 0x50))();
  MeshEncoder::mesh(this_00);
  local_18 = Mesh::GetAttributeElementType
                       (in_stack_fffffffffffffdb0,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  pPVar5 = (PointCloudEncoder *)(**(code **)(*in_RDI + 0x50))();
  PointCloudEncoder::point_cloud(pPVar5);
  local_20 = PointCloud::attribute
                       (&in_stack_fffffffffffffdb0->super_PointCloud,
                        (int32_t)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  local_24 = 0xffffffff;
  for (local_28 = 0; uVar6 = (ulong)local_28,
      sVar7 = std::
              vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
              ::size((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                      *)(in_RDI + 0x32)), uVar6 < sVar7; local_28 = local_28 + 1) {
    pvVar8 = std::
             vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
             ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                           *)(in_RDI + 0x32),(ulong)local_28);
    if (pvVar8->attribute_index == local_14) {
      local_24 = local_28;
      break;
    }
  }
  local_2c = MESH_TRAVERSAL_DEPTH_FIRST;
  std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::
  unique_ptr<std::default_delete<draco::PointsSequencer>,void>
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_stack_fffffffffffffdb0);
  if ((((*(byte *)(in_RDI + 0x56) & 1) == 0) &&
      (TVar3 = GeometryAttribute::attribute_type(&local_20->super_GeometryAttribute),
      TVar3 != POSITION)) && (local_18 != MESH_VERTEX_ATTRIBUTE)) {
    if (local_18 == MESH_CORNER_ATTRIBUTE) {
      pvVar8 = std::
               vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                             *)(in_RDI + 0x32),(long)(int)local_24);
      bVar1 = MeshAttributeCornerTable::no_interior_seams(&pvVar8->connectivity_data);
      if (bVar1) goto LAB_00199991;
    }
    this_02 = (vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
               *)(in_RDI + 0x32);
    pvVar8 = std::
             vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
             ::operator[](this_02,(long)(int)local_24);
    local_70 = &pvVar8->encoding_data;
    pvVar8 = std::
             vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
             ::operator[](this_02,(long)(int)local_24);
    local_78 = &pvVar8->connectivity_data;
    std::
    vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
    ::operator[](this_02,(long)(int)local_24);
    std::
    vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
    ::operator[](this_02,(long)(int)local_24);
    MeshAttributeCornerTable::num_vertices((MeshAttributeCornerTable *)0x199c91);
    local_88.out_point_ids_._4_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
               (size_type)in_stack_fffffffffffffda8,(value_type_conflict1 *)0x199cc1);
    operator_new(0xc0);
    MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
    ::MeshTraversalSequencer
              (in_stack_fffffffffffffdd0,(Mesh *)in_stack_fffffffffffffdc8,
               (MeshAttributeIndicesEncodingData *)in_stack_fffffffffffffdc0);
    pPVar11 = &local_88;
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>,std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>>>
    ::
    unique_ptr<std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>>>>,void>
              ((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                *)in_stack_fffffffffffffdb0,(pointer)in_stack_fffffffffffffda8);
    connectivity = local_78;
    mesh = (Mesh *)in_RDI[2];
    pMVar9 = std::
             unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
             ::get((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                    *)in_stack_fffffffffffffdb0);
    MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::
    MeshAttributeIndicesEncodingObserver
              (&local_a8,connectivity,mesh,&pMVar9->super_PointsSequencer,local_70);
    DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::DepthFirstTraverser
              ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                *)in_stack_fffffffffffffdb0);
    traversal_observer.encoding_data_ =
         (MeshAttributeIndicesEncodingData *)in_stack_fffffffffffffde8;
    traversal_observer.att_connectivity_ = (MeshAttributeCornerTable *)in_stack_fffffffffffffde0;
    traversal_observer.mesh_._0_4_ = in_stack_fffffffffffffdf0;
    traversal_observer.mesh_._4_4_ = in_stack_fffffffffffffdf4;
    traversal_observer.sequencer_ = pPVar11;
    TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,traversal_observer);
    pMVar9 = std::
             unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
             ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                           *)0x199dc4);
    MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
    ::SetCornerOrder(pMVar9,(vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             *)(in_RDI + 0x14));
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
    ::operator->((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                  *)0x199dea);
    MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
    ::SetTraverser((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                    *)local_a8.encoding_data_,
                   (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                    *)local_a8.att_connectivity_);
    std::unique_ptr<draco::PointsSequencer,std::default_delete<draco::PointsSequencer>>::operator=
              ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               local_a8.sequencer_,
               (unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                *)local_a8.mesh_);
    DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
    ::~DepthFirstTraverser
              ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                *)local_a8.encoding_data_);
    std::
    unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
    ::~unique_ptr((unique_ptr<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>,_std::default_delete<draco::MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>_>_>
                   *)local_a8.encoding_data_);
    in_stack_fffffffffffffda8 = local_a8.att_connectivity_;
    in_stack_fffffffffffffdb0 = (Mesh *)local_a8.encoding_data_;
    in_stack_fffffffffffffdb8 = local_a8.mesh_;
    in_stack_fffffffffffffdc0 = (SequentialAttributeEncodersController *)local_a8.sequencer_;
  }
  else {
LAB_00199991:
    if (((*(byte *)(in_RDI + 0x56) & 1) == 0) &&
       (TVar3 = GeometryAttribute::attribute_type(&local_20->super_GeometryAttribute),
       TVar3 != POSITION)) {
      pvVar8 = std::
               vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                             *)(in_RDI + 0x32),(long)(int)local_24);
      local_50 = &pvVar8->encoding_data;
      std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
                ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
                 0x199a45);
      CornerTable::num_vertices((CornerTable *)0x199a4d);
      local_54 = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::assign
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0,
                 (size_type)in_stack_fffffffffffffda8,(value_type_conflict1 *)0x199a80);
      pvVar8 = std::
               vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                             *)(in_RDI + 0x32),(long)(int)local_24);
      pvVar8->is_connectivity_used = false;
    }
    else {
      local_50 = (MeshAttributeIndicesEncodingData *)(in_RDI + 0xc);
    }
    pPVar5 = (PointCloudEncoder *)(**(code **)(*in_RDI + 0x50))();
    this_01 = PointCloudEncoder::options(pPVar5);
    iVar2 = EncoderOptionsBase<int>::GetSpeed(this_01);
    if (((iVar2 == 0) &&
        (TVar3 = GeometryAttribute::attribute_type(&local_20->super_GeometryAttribute),
        TVar3 == POSITION)) &&
       ((local_2c = MESH_TRAVERSAL_PREDICTION_DEGREE, (*(byte *)(in_RDI + 0x56) & 1) != 0 &&
        (iVar4 = PointCloud::num_attributes((PointCloud *)0x199b48), 1 < iVar4)))) {
      local_2c = MESH_TRAVERSAL_DEPTH_FIRST;
    }
    if (local_2c == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      operator=((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdb0,
                (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffda8);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                   *)in_stack_fffffffffffffdb0);
    }
    else if (local_2c == MESH_TRAVERSAL_DEPTH_FIRST) {
      CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      operator=((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdb0,
                (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffda8);
      std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
      ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                   *)in_stack_fffffffffffffdb0);
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                      *)0x199eab);
  if (bVar1) {
    if (local_24 == 0xffffffff) {
      *(MeshTraversalMethod *)(in_RDI + 0x13) = local_2c;
    }
    else {
      MVar10 = local_2c;
      pvVar8 = std::
               vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
               ::operator[]((vector<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                             *)(in_RDI + 0x32),(long)(int)local_24);
      pvVar8->traversal_method = MVar10;
    }
    operator_new(0xa8);
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffdb0,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffda8);
    SequentialAttributeEncodersController::SequentialAttributeEncodersController
              (in_stack_fffffffffffffdc0,
               (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               in_stack_fffffffffffffdb8,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    std::
    unique_ptr<draco::SequentialAttributeEncodersController,std::default_delete<draco::SequentialAttributeEncodersController>>
    ::unique_ptr<std::default_delete<draco::SequentialAttributeEncodersController>,void>
              ((unique_ptr<draco::SequentialAttributeEncodersController,_std::default_delete<draco::SequentialAttributeEncodersController>_>
                *)in_stack_fffffffffffffdb0,(pointer)in_stack_fffffffffffffda8);
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    ~unique_ptr((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
                in_stack_fffffffffffffdb0);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc0,
               (value_type_conflict1 *)in_stack_fffffffffffffdb8);
    (**(code **)(*in_RDI + 0x50))();
    std::unique_ptr<draco::AttributesEncoder,std::default_delete<draco::AttributesEncoder>>::
    unique_ptr<draco::SequentialAttributeEncodersController,std::default_delete<draco::SequentialAttributeEncodersController>,void>
              ((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)in_stack_fffffffffffffdc0,
               (unique_ptr<draco::SequentialAttributeEncodersController,_std::default_delete<draco::SequentialAttributeEncodersController>_>
                *)in_stack_fffffffffffffdb8);
    PointCloudEncoder::AddAttributesEncoder
              ((PointCloudEncoder *)in_stack_fffffffffffffdb0,
               (unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                *)in_stack_fffffffffffffda8);
    std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
    ~unique_ptr((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                 *)in_stack_fffffffffffffdc0);
    local_1 = 1;
    std::
    unique_ptr<draco::SequentialAttributeEncodersController,_std::default_delete<draco::SequentialAttributeEncodersController>_>
    ::~unique_ptr((unique_ptr<draco::SequentialAttributeEncodersController,_std::default_delete<draco::SequentialAttributeEncodersController>_>
                   *)in_stack_fffffffffffffdb0);
  }
  else {
    local_1 = 0;
  }
  std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::~unique_ptr
            ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
             in_stack_fffffffffffffdb0);
LAB_0019a0c0:
  return (bool)(local_1 & 1);
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::GenerateAttributesEncoder(
    int32_t att_id) {
  // For now, either create one encoder for each attribute or use a single
  // encoder for all attributes. Ideally we can share the same encoder for
  // a sub-set of attributes with the same connectivity (this is especially true
  // for per-vertex attributes).
  if (use_single_connectivity_ && GetEncoder()->num_attributes_encoders() > 0) {
    // We are using single connectivity and we already have an attribute
    // encoder. Add the attribute to the encoder and return.
    GetEncoder()->attributes_encoder(0)->AddAttributeId(att_id);
    return true;
  }
  const int32_t element_type =
      GetEncoder()->mesh()->GetAttributeElementType(att_id);
  const PointAttribute *const att =
      GetEncoder()->point_cloud()->attribute(att_id);
  int32_t att_data_id = -1;
  for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
    if (attribute_data_[i].attribute_index == att_id) {
      att_data_id = i;
      break;
    }
  }
  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  std::unique_ptr<PointsSequencer> sequencer;
  if (use_single_connectivity_ ||
      att->attribute_type() == GeometryAttribute::POSITION ||
      element_type == MESH_VERTEX_ATTRIBUTE ||
      (element_type == MESH_CORNER_ATTRIBUTE &&
       attribute_data_[att_data_id].connectivity_data.no_interior_seams())) {
    // Per-vertex attribute reached, use the basic corner table to traverse the
    // mesh.
    MeshAttributeIndicesEncodingData *encoding_data;
    if (use_single_connectivity_ ||
        att->attribute_type() == GeometryAttribute::POSITION) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;

      // Ensure we use the correct number of vertices in the encoding data.
      encoding_data->vertex_to_encoded_attribute_value_index_map.assign(
          corner_table_->num_vertices(), -1);

      // Mark the attribute specific connectivity data as not used as we use the
      // position attribute connectivity data.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }

    if (GetEncoder()->options()->GetSpeed() == 0 &&
        att->attribute_type() == GeometryAttribute::POSITION) {
      traversal_method = MESH_TRAVERSAL_PREDICTION_DEGREE;
      if (use_single_connectivity_ && mesh_->num_attributes() > 1) {
        // Make sure we don't use the prediction degree traversal when we encode
        // multiple attributes using the same connectivity.
        // TODO(ostava): We should investigate this and see if the prediction
        // degree can be actually used efficiently for non-position attributes.
        traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
      }
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    }
  } else {
    // Per-corner attribute encoder.
    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    // Ensure we use the correct number of vertices in the encoding data.
    attribute_data_[att_data_id]
        .encoding_data.vertex_to_encoded_attribute_value_index_map.assign(
            attribute_data_[att_data_id].connectivity_data.num_vertices(), -1);

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh_, encoding_data));

    AttObserver att_observer(corner_table, mesh_, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    // Set order of corners to simulate the corner order of the decoder.
    traversal_sequencer->SetCornerOrder(processed_connectivity_corners_);
    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  if (att_data_id == -1) {
    pos_traversal_method_ = traversal_method;
  } else {
    attribute_data_[att_data_id].traversal_method = traversal_method;
  }

  std::unique_ptr<SequentialAttributeEncodersController> att_controller(
      new SequentialAttributeEncodersController(std::move(sequencer), att_id));

  // Update the mapping between the encoder id and the attribute data id.
  // This will be used by the decoder to select the appropriate attribute
  // decoder and the correct connectivity.
  attribute_encoder_to_data_id_map_.push_back(att_data_id);
  GetEncoder()->AddAttributesEncoder(std::move(att_controller));
  return true;
}